

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O3

D_Scope * enter_D_Scope(D_Scope *current,D_Scope *scope)

{
  D_Scope *pDVar1;
  D_Scope *pDVar2;
  
  pDVar2 = (D_Scope *)calloc(1,0x50);
  pDVar1 = scope->up;
  pDVar2->depth = scope->depth;
  pDVar2->up = pDVar1;
  *(byte *)pDVar2 = *(byte *)scope & 3;
  pDVar2->search = scope;
  pDVar2->up_updates = current;
  pDVar2->down_next = current->down;
  current->down = pDVar2;
  return pDVar2;
}

Assistant:

D_Scope *enter_D_Scope(D_Scope *current, D_Scope *scope) {
  D_Scope *st = MALLOC(sizeof(D_Scope)), *parent = scope->up;
  memset(st, 0, sizeof(D_Scope));
  st->depth = scope->depth;
  st->up = parent;
  st->kind = scope->kind;
  st->search = scope;
#if 0
  /* clear old updates */
  {
    D_Scope *update_scope = current;
    while (update_scope) {
      D_Sym *sy = update_scope->updates;
      while (sy) {
        if (sy->scope->depth <= current->depth)
          goto Lfound;
        sy = sy->next;
      }
      update_scope = update_scope->up_updates;
    }
Lfound:
    st->up_updates = update_scope;
  }
#else
  st->up_updates = current;
#endif
  st->down_next = current->down;
  current->down = st;
  return st;
}